

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushOverrideID(ImGuiID id)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)GImGui,(uint *)GImGui->CurrentWindow);
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->IDStack.push_back(id);
}